

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.h
# Opt level: O0

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoPyramid>::AddElement
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoPyramid> *this,TPZCompElSide *celside,
          int64_t meshindex)

{
  int64_t iVar1;
  TPZCompElSide *pTVar2;
  long in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  int *unaff_retaddr;
  int64_t in_stack_00000008;
  TPZManVector<int,_5> *in_stack_00000010;
  int64_t in_stack_ffffffffffffffc8;
  TPZVec<TPZCompElSide> *in_stack_ffffffffffffffd0;
  
  iVar1 = TPZVec<TPZCompElSide>::size((TPZVec<TPZCompElSide> *)(in_RDI + 0x78));
  if (iVar1 <= in_RDX) {
    TPZVec<TPZCompElSide>::resize(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    TPZManVector<int,_5>::Resize(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  }
  pTVar2 = TPZVec<TPZCompElSide>::operator[]((TPZVec<TPZCompElSide> *)(in_RDI + 0x78),in_RDX);
  pTVar2->fEl = (TPZCompEl *)*in_RSI;
  pTVar2->fSide = *(int *)(in_RSI + 1);
  return;
}

Assistant:

virtual void AddElement(const TPZCompElSide &celside, int64_t meshindex) override
    {
        if (fElementVec.size() <= meshindex)
        {
            fElementVec.resize(meshindex+1);
            fActiveApproxSpace.Resize(meshindex+1, 1);
        }
        fElementVec[meshindex] = celside;
    }